

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *tol)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestCo;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  SPxId enterCoId;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff948;
  undefined6 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff956;
  undefined1 in_stack_fffffffffffff957;
  byte bVar5;
  undefined8 local_698;
  undefined1 local_690 [80];
  undefined1 local_640 [64];
  double in_stack_fffffffffffffa00;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffa08;
  undefined1 local_5f0 [80];
  DataKey local_5a0;
  undefined1 local_598 [80];
  undefined1 local_548 [80];
  DataKey local_4f8;
  undefined1 local_4f0 [56];
  int in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb68;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb70;
  DataKey local_450;
  undefined1 local_448 [40];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbe0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbe8;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbf0;
  undefined1 local_3f8 [80];
  DataKey local_3a8;
  undefined1 local_3a0 [80];
  undefined1 local_350 [80];
  DataKey local_300;
  undefined1 local_2f8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd48;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd50;
  undefined1 local_2a8 [80];
  DataKey local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined4 local_240;
  undefined4 local_23c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  undefined1 local_1e8 [80];
  DataKey local_198;
  DataKey local_190 [3];
  DataKey local_178;
  undefined1 *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined4 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined4 *local_150;
  undefined1 *local_148;
  undefined1 *local_138;
  undefined1 *local_128;
  undefined1 *local_118;
  undefined1 *local_108;
  undefined1 *local_f8;
  undefined1 *local_e8;
  undefined1 *local_d8;
  undefined1 *local_c8;
  undefined1 *local_b8;
  undefined1 *local_a8;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined8 *local_70;
  long local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  long local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  SPxId::SPxId((SPxId *)0x5cd466);
  SPxId::SPxId((SPxId *)0x5cd473);
  local_170 = local_1e8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
  local_168 = &local_238;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
  local_23c = 0;
  local_148 = local_1e8;
  local_150 = &local_23c;
  local_80 = local_150;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             (long_long_type)in_stack_fffffffffffff948);
  local_240 = 0;
  local_158 = &local_238;
  local_160 = &local_240;
  local_78 = local_160;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff957,
                      CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
             (long_long_type)in_stack_fffffffffffff948);
  local_248 = 0x3ff0000000000000;
  local_50 = in_RDI + 0x80;
  local_58 = &local_248;
  local_48 = local_58;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_250 = 0x3ff0000000000000;
  local_68 = in_RDI + 0x80;
  local_70 = &local_250;
  local_60 = local_70;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0xf84) & 1) == 0) ||
     ((*(byte *)(in_RDI + 0x140) & 1) != 0)) {
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0xf81) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0x140) & 1) != 0)) {
      local_a8 = local_598;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_4f8 = (DataKey)selectEnterDenseDim(in_stack_fffffffffffffb60,
                                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_fffffffffffffb5c,
                                                           in_stack_fffffffffffffb58),
                                               in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                                               in_stack_fffffffffffffb48);
    }
    else {
      local_b8 = local_548;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_4f8 = (DataKey)selectEnterSparseDim
                                     (in_stack_fffffffffffffb60,
                                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)CONCAT44(in_stack_fffffffffffffb5c,
                                                  in_stack_fffffffffffffb58),
                                      in_stack_fffffffffffffb50);
    }
    local_198 = local_4f8;
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0xf82) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0x140) & 1) != 0)) {
      local_88 = local_640;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_5a0 = (DataKey)selectEnterDenseCoDim
                                     (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                                      in_stack_fffffffffffffb58);
    }
    else {
      local_98 = local_5f0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_5a0 = (DataKey)selectEnterSparseCoDim
                                     (in_stack_fffffffffffffb60,
                                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)CONCAT44(in_stack_fffffffffffffb5c,
                                                  in_stack_fffffffffffffb58),
                                      in_stack_fffffffffffffb50);
    }
    local_190[0] = local_5a0;
    goto LAB_005cdbbc;
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0x100));
  if (iVar3 < 2) {
LAB_005cd66a:
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xf81) & 1) == 0) {
      local_128 = local_2f8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_258 = (DataKey)selectEnterDenseDim(in_stack_fffffffffffffb60,
                                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_fffffffffffffb5c,
                                                           in_stack_fffffffffffffb58),
                                               in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                                               in_stack_fffffffffffffb48);
    }
    else {
      local_138 = local_2a8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_258 = (DataKey)buildBestPriceVectorEnterDim
                                     (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                      in_stack_fffffffffffffbe0);
    }
    local_198 = local_258;
  }
  else {
    pSVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::basis(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       **)(in_RDI + 0x10));
    iVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::lastUpdate(pSVar4);
    if (iVar3 == 0) goto LAB_005cd66a;
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xf81) & 1) == 0) {
      local_108 = local_3a0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_300 = (DataKey)selectEnterDenseDim(in_stack_fffffffffffffb60,
                                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_fffffffffffffb5c,
                                                           in_stack_fffffffffffffb58),
                                               in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                                               in_stack_fffffffffffffb48);
    }
    else {
      local_118 = local_350;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff957,
                          CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                 in_stack_fffffffffffff948);
      local_300 = (DataKey)selectEnterHyperDim(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                               in_stack_fffffffffffffd40);
    }
    local_198 = local_300;
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0x120));
  if (1 < iVar3) {
    pSVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::basis(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       **)(in_RDI + 0x10));
    iVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::lastUpdate(pSVar4);
    if (iVar3 != 0) {
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xf82) & 1) == 0) {
        local_c8 = local_4f0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff957,
                            CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                   in_stack_fffffffffffff948);
        local_450 = (DataKey)selectEnterDenseCoDim
                                       (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                                        in_stack_fffffffffffffb58);
      }
      else {
        local_d8 = &stack0xfffffffffffffb60;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff957,
                            CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
                   in_stack_fffffffffffff948);
        local_450 = (DataKey)selectEnterHyperCoDim
                                       (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                        in_stack_fffffffffffffd40);
      }
      local_190[0] = local_450;
      goto LAB_005cdbbc;
    }
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xf82) & 1) == 0) {
    local_e8 = local_448;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
               in_stack_fffffffffffff948);
    local_3a8 = (DataKey)selectEnterDenseCoDim
                                   (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                                    in_stack_fffffffffffffb58);
  }
  else {
    local_f8 = local_3f8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff957,
                        CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
               in_stack_fffffffffffff948);
    local_3a8 = (DataKey)buildBestPriceVectorEnterCoDim
                                   (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                    in_stack_fffffffffffffbe0);
  }
  local_190[0] = local_3a8;
LAB_005cdbbc:
  bVar1 = SPxId::isValid((SPxId *)&local_198);
  bVar5 = 0;
  if (bVar1) {
    local_698 = 0x3fe999999999999a;
    local_28 = local_690;
    local_30 = &local_698;
    local_38 = &local_238;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_690;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
    local_10 = local_690;
    local_18 = local_38;
    local_8 = local_30;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)),
               in_stack_fffffffffffff948,(double *)0x5cdc8c);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff948,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x5cdc9e);
    bVar5 = 1;
    if (!tVar2) {
      bVar1 = SPxId::isValid((SPxId *)local_190);
      bVar5 = bVar1 ^ 0xff;
    }
  }
  if ((bVar5 & 1) == 0) {
    local_178 = local_190[0];
  }
  else {
    local_178 = local_198;
  }
  return (SPxId)local_178;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}